

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O0

TapScriptInfoStruct *
cfd::js::api::AddressStructApi::GetTapScriptTreeInfoByControlBlock
          (TapScriptInfoStruct *__return_storage_ptr__,TapScriptInfoByControlRequestStruct *request)

{
  TapScriptInfoByControlRequestStruct *this;
  string *in_R8;
  allocator local_241;
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  local_240;
  undefined1 local_220 [518];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  TapScriptInfoByControlRequestStruct *pTStack_18;
  anon_class_1_0_00000001 call_func;
  TapScriptInfoByControlRequestStruct *request_local;
  TapScriptInfoStruct *result;
  
  local_1a = 0;
  pTStack_18 = request;
  TapScriptInfoStruct::TapScriptInfoStruct(__return_storage_ptr__);
  this = pTStack_18;
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
  ::
  function<cfd::js::api::AddressStructApi::GetTapScriptTreeInfoByControlBlock(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptInfoByControlRequestStruct_const&)>
              *)local_220,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"GetTapScriptTreeInfoByControlBlock",&local_241)
  ;
  ExecuteStructApi<cfd::js::api::TapScriptInfoByControlRequestStruct,cfd::js::api::TapScriptInfoStruct>
            ((TapScriptInfoStruct *)(local_220 + 0x20),(api *)this,
             (TapScriptInfoByControlRequestStruct *)local_220,&local_240,in_R8);
  TapScriptInfoStruct::operator=(__return_storage_ptr__,(TapScriptInfoStruct *)(local_220 + 0x20));
  TapScriptInfoStruct::~TapScriptInfoStruct((TapScriptInfoStruct *)(local_220 + 0x20));
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  ::~function((function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
               *)local_220);
  return __return_storage_ptr__;
}

Assistant:

TapScriptInfoStruct AddressStructApi::GetTapScriptTreeInfoByControlBlock(
    const TapScriptInfoByControlRequestStruct& request) {
  auto call_func = [](const TapScriptInfoByControlRequestStruct& request)
      -> TapScriptInfoStruct {  // NOLINT
    NetType net_type = ConvertNetType(request.network);
    AddressFactory api(net_type);
    return AddressApiBase::GetTapScriptTreeInfoByControlBlock(request, &api);
  };

  TapScriptInfoStruct result;
  result = ExecuteStructApi<
      TapScriptInfoByControlRequestStruct, TapScriptInfoStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}